

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<chaiscript::Boxed_Value_(chaiscript::Boxed_Value,_const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_&),_chaiscript::Boxed_Value_(*)(chaiscript::Boxed_Value,_const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_&)>
::~Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<chaiscript::Boxed_Value_(chaiscript::Boxed_Value,_const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_&),_chaiscript::Boxed_Value_(*)(chaiscript::Boxed_Value,_const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_&)>
           *this)

{
  Proxy_Function_Base::~Proxy_Function_Base((Proxy_Function_Base *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

explicit Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr)))
          , m_f(std::move(f)) {
      }